

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImTextCharToUtf8(char *out_buf,uint c)

{
  long lVar1;
  byte bVar2;
  
  bVar2 = (byte)c;
  if (c < 0x80) {
    *out_buf = bVar2;
    lVar1 = 1;
  }
  else if (c < 0x800) {
    *out_buf = (byte)(c >> 6) | 0xc0;
    out_buf[1] = bVar2 & 0x3f | 0x80;
    lVar1 = 2;
  }
  else if (c < 0x10000) {
    *out_buf = (byte)(c >> 0xc) | 0xe0;
    out_buf[1] = (byte)(c >> 6) & 0x3f | 0x80;
    out_buf[2] = bVar2 & 0x3f | 0x80;
    lVar1 = 3;
  }
  else if (c < 0x110000) {
    *out_buf = (byte)(c >> 0x12) | 0xf0;
    out_buf[1] = (byte)(c >> 0xc) & 0x3f | 0x80;
    out_buf[2] = (byte)(c >> 6) & 0x3f | 0x80;
    out_buf[3] = bVar2 & 0x3f | 0x80;
    lVar1 = 4;
  }
  else {
    lVar1 = 0;
  }
  out_buf[lVar1] = '\0';
  return out_buf;
}

Assistant:

const char* ImTextCharToUtf8(char out_buf[5], unsigned int c)
{
    int count = ImTextCharToUtf8_inline(out_buf, 5, c);
    out_buf[count] = 0;
    return out_buf;
}